

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::loadGraph(Graph *this)

{
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  Graph *this_00;
  int iVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  string val;
  fstream file;
  char *local_278;
  char *local_270;
  char *local_268;
  char local_260;
  undefined7 uStack_25f;
  Graph *local_250;
  int (*local_248) [50];
  long local_240 [4];
  int aiStack_220 [124];
  
  local_270 = &local_260;
  local_268 = (char *)0x0;
  local_260 = '\0';
  std::fstream::fstream(local_240,"graph.txt",_S_in);
  if (*(int *)((long)aiStack_220 + *(long *)(local_240[0] + -0x18)) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error while opening the file",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
LAB_001039a9:
    std::fstream::~fstream(local_240);
    if (local_270 != &local_260) {
      operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
    }
    return;
  }
  lVar7 = (long)this->num_of_vert;
  if (0 < lVar7) {
    lVar9 = 0;
    do {
      memset((void *)((long)this->adj_matrix[0] + lVar9),0,lVar7 << 2);
      lVar9 = lVar9 + 200;
    } while (lVar7 * 200 - lVar9 != 0);
  }
  std::operator>>((istream *)local_240,(string *)&local_270);
  pcVar2 = local_270;
  local_250 = this;
  piVar5 = __errno_location();
  iVar6 = *piVar5;
  *piVar5 = 0;
  lVar7 = strtol(pcVar2,&local_278,10);
  if (local_278 == pcVar2) {
LAB_00103a11:
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar10 = (int)lVar7;
    if ((iVar10 == lVar7) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar6;
      }
      local_250->num_of_vert = iVar10;
      if (0 < iVar10) {
        local_248 = local_250->adj_matrix;
        iVar6 = 0;
        iVar8 = 0;
        do {
          std::operator>>((istream *)local_240,(string *)&local_270);
          iVar4 = std::__cxx11::string::compare((char *)&local_270);
          if (iVar4 == 0) {
            iVar6 = 0;
            std::__cxx11::string::_M_replace((ulong)&local_270,0,local_268,0x105107);
            iVar8 = iVar8 + 1;
          }
          pcVar2 = local_270;
          iVar4 = *piVar5;
          *piVar5 = 0;
          lVar7 = strtol(local_270,&local_278,10);
          pcVar3 = local_270;
          if (local_278 == pcVar2) {
            std::__throw_invalid_argument("stoi");
LAB_001039ed:
            std::__throw_out_of_range("stoi");
LAB_001039f9:
            std::__throw_out_of_range("stoi");
LAB_00103a05:
            std::__throw_invalid_argument("stoi");
            goto LAB_00103a11;
          }
          if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_001039ed;
          if (*piVar5 == 0) {
            *piVar5 = iVar4;
          }
          if ((int)lVar7 != 0) {
            iVar4 = *piVar5;
            *piVar5 = 0;
            lVar7 = strtol(local_270,&local_278,10);
            if (local_278 != pcVar3) {
              if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar5 != 0x22)) {
                if (*piVar5 == 0) {
                  *piVar5 = iVar4;
                }
                piVar1 = (int *)((long)local_248[iVar8] + ((lVar7 << 0x20) + -0x100000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                goto LAB_00103976;
              }
              goto LAB_001039f9;
            }
            goto LAB_00103a05;
          }
LAB_00103976:
          this_00 = local_250;
          iVar6 = iVar6 + 1;
        } while ((iVar6 < iVar10) || (iVar6 = 0, iVar8 < iVar10));
        createList(local_250);
        createPredList(this_00);
        goto LAB_001039a9;
      }
      goto LAB_00103a29;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_00103a29:
  std::operator<<((ostream *)&std::cerr,"Graph can\'t have less than 1 vertices");
  exit(1);
}

Assistant:

void Graph::loadGraph(){
   string val; int nv = 0; fstream file("graph.txt", ios::in);
   if(file.good()){
      this->clearMatrix();
      // reads number of vertices (first line)
      file >> val;
      nv = this->num_of_vert = stoi(val);
      if(nv < 1){
         cerr << "Graph can't have less than 1 vertices";
         exit(EXIT_FAILURE);
      }
      for(int i = 0; i < nv;){
         for(int j = 0; j < nv; j++){
            // read the number
            file >> val;
            // if end of number then go to next line(vertex),
            if(val == "/"){
               // set columns to zero, and empty our 'val' variable
               i++;
               j = 0;
               val = "0";
            }
            // if number is good then put '1' in the column which the number is pointing (number - 1, starting from 0)
            if(stoi(val) not_eq 0)
               this->adj_matrix[i][stoi(val) - 1] += 1;
         }
      }
      this->createList();
      this->createPredList();
   }else{
      cout << "Error while opening the file" << endl;
   }
   return void();
}